

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# XMLURL.cpp
# Opt level: O1

void __thiscall xercesc_4_0::XMLURL::parse(XMLURL *this,XMLCh *urlText)

{
  short *psVar1;
  MemoryManager *pMVar2;
  bool bVar3;
  int iVar4;
  Protocols PVar5;
  undefined4 extraout_var;
  XMLCh *pXVar6;
  XMLCh *pXVar7;
  XMLCh *pXVar8;
  undefined4 extraout_var_01;
  XMLCh *__dest;
  undefined4 extraout_var_03;
  undefined4 extraout_var_04;
  undefined4 extraout_var_05;
  undefined4 extraout_var_06;
  undefined4 extraout_var_07;
  undefined4 extraout_var_08;
  undefined4 extraout_var_09;
  undefined4 extraout_var_10;
  MalformedURLException *pMVar9;
  ulong uVar10;
  size_t sVar11;
  long lVar12;
  ArrayJanitor<char16_t> janSrcCopy;
  ArrayJanitor<char16_t> local_40;
  char16_t *toDelete;
  undefined4 extraout_var_00;
  undefined4 extraout_var_02;
  
  if (*urlText == L'\0') {
    pMVar9 = (MalformedURLException *)__cxa_allocate_exception(0x30);
    MalformedURLException::MalformedURLException
              (pMVar9,
               "/workspace/llm4binary/github/license_c_cmakelists/apache[P]xerces-c/src/xercesc/util/XMLURL.cpp"
               ,0x3a8,URL_NoProtocolPresent,this->fMemoryManager);
LAB_0025efea:
    __cxa_throw(pMVar9,&MalformedURLException::typeinfo,XMLException::~XMLException);
  }
  bVar3 = XMLUri::isURIString(urlText);
  this->fHasInvalidChar = !bVar3;
  if ((((ushort)((*urlText & 0xffdfU) - 0x41U) < 0x1a) && (urlText[1] == L':')) &&
     ((urlText[2] == L'\\' || (urlText[2] == L'/')))) {
    pMVar9 = (MalformedURLException *)__cxa_allocate_exception(0x30);
    MalformedURLException::MalformedURLException
              (pMVar9,
               "/workspace/llm4binary/github/license_c_cmakelists/apache[P]xerces-c/src/xercesc/util/XMLURL.cpp"
               ,0x3bd,URL_NoProtocolPresent,this->fMemoryManager);
    goto LAB_0025efea;
  }
  sVar11 = 0;
  do {
    psVar1 = (short *)((long)urlText + sVar11);
    sVar11 = sVar11 + 2;
  } while (*psVar1 != 0);
  iVar4 = (*this->fMemoryManager->_vptr_MemoryManager[3])(this->fMemoryManager,sVar11);
  toDelete = (char16_t *)CONCAT44(extraout_var,iVar4);
  memcpy(toDelete,urlText,sVar11);
  ArrayJanitor<char16_t>::ArrayJanitor(&local_40,toDelete,this->fMemoryManager);
  uVar10 = (ulong)(ushort)*toDelete;
  bVar3 = uVar10 == 0;
  if (bVar3) {
LAB_0025ef54:
    pMVar9 = (MalformedURLException *)__cxa_allocate_exception(0x30);
    MalformedURLException::MalformedURLException
              (pMVar9,
               "/workspace/llm4binary/github/license_c_cmakelists/apache[P]xerces-c/src/xercesc/util/XMLURL.cpp"
               ,0x3d6,URL_NoProtocolPresent,this->fMemoryManager);
    __cxa_throw(pMVar9,&MalformedURLException::typeinfo,XMLException::~XMLException);
  }
  while ((char)(&XMLChar1_0::fgCharCharsTable1_0)[uVar10] < '\0') {
    uVar10 = (ulong)(ushort)toDelete[1];
    bVar3 = uVar10 == 0;
    if (bVar3) goto LAB_0025ef54;
    toDelete = toDelete + 1;
  }
  if (bVar3) goto LAB_0025ef54;
  pXVar6 = XMLString::findAny(toDelete,L":/");
  if ((pXVar6 != (XMLCh *)0x0) && (*pXVar6 == L':')) {
    *pXVar6 = L'\0';
    lVar12 = 8;
    do {
      iVar4 = XMLString::compareIStringASCII(toDelete,*(XMLCh **)((long)&gProtoList + lVar12));
      if (iVar4 == 0) {
        PVar5 = *(Protocols *)(&UNK_0040d418 + lVar12);
        goto LAB_0025eae8;
      }
      lVar12 = lVar12 + 0x18;
    } while (lVar12 != 0x68);
    PVar5 = Unknown;
LAB_0025eae8:
    this->fProtocol = PVar5;
    if (PVar5 == Unknown) {
      pMVar9 = (MalformedURLException *)__cxa_allocate_exception(0x30);
      MalformedURLException::MalformedURLException
                (pMVar9,
                 "/workspace/llm4binary/github/license_c_cmakelists/apache[P]xerces-c/src/xercesc/util/XMLURL.cpp"
                 ,0x3f3,URL_UnsupportedProto1,toDelete,(XMLCh *)0x0,(XMLCh *)0x0,(XMLCh *)0x0,
                 this->fMemoryManager);
      goto LAB_0025f068;
    }
    toDelete = pXVar6 + 1;
  }
  if ((*toDelete == L'/') && (toDelete[1] == L'/')) {
    pXVar6 = toDelete + 2;
    if (toDelete[2] != L'\0') {
      pXVar7 = XMLString::findAny(pXVar6,L"/");
      if (pXVar7 == (XMLCh *)0x0) {
        (*this->fMemoryManager->_vptr_MemoryManager[4])(this->fMemoryManager,this->fHost);
        sVar11 = 0;
        do {
          psVar1 = (short *)((long)pXVar6 + sVar11);
          sVar11 = sVar11 + 2;
        } while (*psVar1 != 0);
        iVar4 = (*this->fMemoryManager->_vptr_MemoryManager[3])(this->fMemoryManager,sVar11);
        pXVar7 = (XMLCh *)CONCAT44(extraout_var_01,iVar4);
        memcpy(pXVar7,pXVar6,sVar11);
        this->fHost = pXVar7;
        lVar12 = 0;
        if (pXVar7 != (XMLCh *)0x0) {
          do {
            psVar1 = (short *)((long)pXVar7 + lVar12);
            lVar12 = lVar12 + 2;
          } while (*psVar1 != 0);
          lVar12 = (lVar12 >> 1) + -1;
        }
        pXVar6 = pXVar6 + lVar12;
      }
      else if ((long)pXVar7 - (long)pXVar6 != 0) {
        (*this->fMemoryManager->_vptr_MemoryManager[4])(this->fMemoryManager,this->fHost);
        iVar4 = (*this->fMemoryManager->_vptr_MemoryManager[3])
                          (this->fMemoryManager,((long)pXVar7 - (long)pXVar6) + 2);
        pXVar8 = (XMLCh *)CONCAT44(extraout_var_00,iVar4);
        this->fHost = pXVar8;
        for (; pXVar6 < pXVar7; pXVar6 = pXVar6 + 1) {
          *pXVar8 = *pXVar6;
          pXVar8 = pXVar8 + 1;
        }
        *pXVar8 = L'\0';
      }
    }
  }
  else {
    pXVar6 = toDelete;
    if (this->fProtocol == HTTP) {
      pMVar9 = (MalformedURLException *)__cxa_allocate_exception(0x30);
      MalformedURLException::MalformedURLException
                (pMVar9,
                 "/workspace/llm4binary/github/license_c_cmakelists/apache[P]xerces-c/src/xercesc/util/XMLURL.cpp"
                 ,0x438,URL_ExpectingTwoSlashes,this->fMemoryManager);
      goto LAB_0025f068;
    }
  }
  if (this->fHost != (XMLCh *)0x0) {
    pXVar7 = XMLString::findAny(this->fHost,L"@");
    if (pXVar7 != (XMLCh *)0x0) {
      *pXVar7 = L'\0';
      (*this->fMemoryManager->_vptr_MemoryManager[4])(this->fMemoryManager,this->fUser);
      pXVar8 = this->fHost;
      if (pXVar8 == (XMLCh *)0x0) {
        __dest = (XMLCh *)0x0;
      }
      else {
        sVar11 = 0;
        do {
          psVar1 = (short *)((long)pXVar8 + sVar11);
          sVar11 = sVar11 + 2;
        } while (*psVar1 != 0);
        iVar4 = (*this->fMemoryManager->_vptr_MemoryManager[3])(this->fMemoryManager,sVar11);
        __dest = (XMLCh *)CONCAT44(extraout_var_02,iVar4);
        memcpy(__dest,pXVar8,sVar11);
      }
      this->fUser = __dest;
      XMLString::cut(this->fHost,(long)pXVar7 + (2 - (long)this->fHost) >> 1);
      pXVar7 = XMLString::findAny(this->fUser,L":");
      if (pXVar7 != (XMLCh *)0x0) {
        *pXVar7 = L'\0';
        (*this->fMemoryManager->_vptr_MemoryManager[4])(this->fMemoryManager,this->fPassword);
        sVar11 = 0;
        do {
          psVar1 = (short *)((long)(pXVar7 + 1) + sVar11);
          sVar11 = sVar11 + 2;
        } while (*psVar1 != 0);
        iVar4 = (*this->fMemoryManager->_vptr_MemoryManager[3])(this->fMemoryManager,sVar11);
        memcpy((XMLCh *)CONCAT44(extraout_var_03,iVar4),pXVar7 + 1,sVar11);
        this->fPassword = (XMLCh *)CONCAT44(extraout_var_03,iVar4);
      }
    }
    pXVar7 = XMLString::findAny(this->fHost,L":");
    if (pXVar7 != (XMLCh *)0x0) {
      *pXVar7 = L'\0';
      bVar3 = XMLString::textToBin(pXVar7 + 1,&this->fPortNum,this->fMemoryManager);
      if (!bVar3) {
        pMVar9 = (MalformedURLException *)__cxa_allocate_exception(0x30);
        MalformedURLException::MalformedURLException
                  (pMVar9,
                   "/workspace/llm4binary/github/license_c_cmakelists/apache[P]xerces-c/src/xercesc/util/XMLURL.cpp"
                   ,0x46f,URL_BadPortField,this->fMemoryManager);
LAB_0025f068:
        __cxa_throw(pMVar9,&MalformedURLException::typeinfo,XMLException::~XMLException);
      }
    }
    if (*this->fHost == L'\0') {
      (*this->fMemoryManager->_vptr_MemoryManager[4])();
      this->fHost = (XMLCh *)0x0;
    }
  }
  if (*pXVar6 == L'\0') {
    if (this->fHost != (XMLCh *)0x0) {
      iVar4 = (*this->fMemoryManager->_vptr_MemoryManager[3])(this->fMemoryManager,4);
      pXVar6 = (XMLCh *)CONCAT44(extraout_var_05,iVar4);
      pXVar6[0] = L'/';
      pXVar6[1] = L'\0';
      this->fPath = pXVar6;
    }
  }
  else {
    pXVar7 = XMLString::findAny(pXVar6,L"#?");
    if (pXVar7 == (XMLCh *)0x0) {
      (*this->fMemoryManager->_vptr_MemoryManager[4])(this->fMemoryManager,this->fPath);
      sVar11 = 0;
      do {
        psVar1 = (short *)((long)pXVar6 + sVar11);
        sVar11 = sVar11 + 2;
      } while (*psVar1 != 0);
      iVar4 = (*this->fMemoryManager->_vptr_MemoryManager[3])(this->fMemoryManager,sVar11);
      memcpy((XMLCh *)CONCAT44(extraout_var_06,iVar4),pXVar6,sVar11);
      this->fPath = (XMLCh *)CONCAT44(extraout_var_06,iVar4);
    }
    else {
      if (pXVar6 <= pXVar7 && (long)pXVar7 - (long)pXVar6 != 0) {
        (*this->fMemoryManager->_vptr_MemoryManager[4])(this->fMemoryManager,this->fPath);
        iVar4 = (*this->fMemoryManager->_vptr_MemoryManager[3])
                          (this->fMemoryManager,((long)pXVar7 - (long)pXVar6) + 2);
        pXVar8 = (XMLCh *)CONCAT44(extraout_var_04,iVar4);
        this->fPath = pXVar8;
        for (; pXVar6 < pXVar7; pXVar6 = pXVar6 + 1) {
          *pXVar8 = *pXVar6;
          pXVar8 = pXVar8 + 1;
        }
        *pXVar8 = L'\0';
      }
      if (*pXVar6 == L'#') {
        (*this->fMemoryManager->_vptr_MemoryManager[4])(this->fMemoryManager,this->fFragment);
        pXVar6 = pXVar6 + 1;
        sVar11 = 0;
        do {
          psVar1 = (short *)((long)pXVar6 + sVar11);
          sVar11 = sVar11 + 2;
        } while (*psVar1 != 0);
        iVar4 = (*this->fMemoryManager->_vptr_MemoryManager[3])(this->fMemoryManager,sVar11);
        pXVar7 = (XMLCh *)CONCAT44(extraout_var_07,iVar4);
      }
      else {
        pXVar6 = pXVar6 + 1;
        pXVar7 = XMLString::findAny(pXVar6,L"#");
        (*this->fMemoryManager->_vptr_MemoryManager[4])(this->fMemoryManager,this->fQuery);
        pMVar2 = this->fMemoryManager;
        if (pXVar7 == (XMLCh *)0x0) {
          sVar11 = 0;
          do {
            psVar1 = (short *)((long)pXVar6 + sVar11);
            sVar11 = sVar11 + 2;
          } while (*psVar1 != 0);
          iVar4 = (*pMVar2->_vptr_MemoryManager[3])(pMVar2,sVar11);
          memcpy((XMLCh *)CONCAT44(extraout_var_10,iVar4),pXVar6,sVar11);
          this->fQuery = (XMLCh *)CONCAT44(extraout_var_10,iVar4);
          goto LAB_0025ef3b;
        }
        iVar4 = (*pMVar2->_vptr_MemoryManager[3])(pMVar2,(long)pXVar7 + (2 - (long)pXVar6));
        pXVar8 = (XMLCh *)CONCAT44(extraout_var_08,iVar4);
        this->fQuery = pXVar8;
        for (; pXVar6 < pXVar7; pXVar6 = pXVar6 + 1) {
          *pXVar8 = *pXVar6;
          pXVar8 = pXVar8 + 1;
        }
        *pXVar8 = L'\0';
        if (*pXVar6 != L'#') goto LAB_0025ef3b;
        (*this->fMemoryManager->_vptr_MemoryManager[4])(this->fMemoryManager,this->fFragment);
        pXVar6 = pXVar6 + 1;
        sVar11 = 0;
        do {
          psVar1 = (short *)((long)pXVar6 + sVar11);
          sVar11 = sVar11 + 2;
        } while (*psVar1 != 0);
        iVar4 = (*this->fMemoryManager->_vptr_MemoryManager[3])(this->fMemoryManager,sVar11);
        pXVar7 = (XMLCh *)CONCAT44(extraout_var_09,iVar4);
      }
      memcpy(pXVar7,pXVar6,sVar11);
      this->fFragment = pXVar7;
    }
  }
LAB_0025ef3b:
  ArrayJanitor<char16_t>::~ArrayJanitor(&local_40);
  return;
}

Assistant:

void XMLURL::parse(const XMLCh* const urlText)
{
    // Simplify things by checking for the psycho scenarios first
    if (!*urlText)
        ThrowXMLwithMemMgr(MalformedURLException, XMLExcepts::URL_NoProtocolPresent, fMemoryManager);

    // Before we start, check if this urlText contains valid uri characters
    if (!XMLUri::isURIString(urlText))
        fHasInvalidChar = true;
    else
        fHasInvalidChar = false;

    //
    //  The first thing we will do is to check for a file name, so that
    //  we don't waste time thinking its a URL. If its in the form x:\ or x:/
    //  and x is an ASCII letter, then assume that's the deal.
    //
    if (((*urlText >= chLatin_A) && (*urlText <= chLatin_Z))
    ||  ((*urlText >= chLatin_a) && (*urlText <= chLatin_z)))
    {
        if (*(urlText + 1) == chColon)
        {
            if ((*(urlText + 2) == chForwardSlash)
            ||  (*(urlText + 2) == chBackSlash))
            {
                ThrowXMLwithMemMgr(MalformedURLException, XMLExcepts::URL_NoProtocolPresent, fMemoryManager);
            }
        }
    }

    // Get a copy of the URL that we can modify
    XMLCh* srcCpy = XMLString::replicate(urlText, fMemoryManager);
    ArrayJanitor<XMLCh> janSrcCopy(srcCpy, fMemoryManager);

    //
    //  Get a pointer now that we can run up thrown the source as we parse
    //  bits and pieces out of it.
    //
    XMLCh* srcPtr = srcCpy;

    // Run up past any spaces
    while (*srcPtr)
    {
        if (!XMLChar1_0::isWhitespace(*srcPtr))
            break;
        srcPtr++;
    }

    // Make sure it wasn't all space
    if (!*srcPtr)
        ThrowXMLwithMemMgr(MalformedURLException, XMLExcepts::URL_NoProtocolPresent, fMemoryManager);

    //
    //  Ok, the next thing we have to do is to find either a / or : character.
    //  If the : is first, we assume we have a protocol. If the / is first,
    //  then we skip to the host processing.
    //
    XMLCh* ptr1 = XMLString::findAny(srcPtr, gListOne);
    XMLCh* ptr2;

    // If we found a protocol, then deal with it
    if (ptr1)
    {
        if (*ptr1 == chColon)
        {
            // Cap the string at the colon
            *ptr1 = 0;

            // And try to find it in our list of protocols
            fProtocol = lookupByName(srcPtr);

            if (fProtocol == Unknown)
            {
                ThrowXMLwithMemMgr1
                (
                    MalformedURLException
                    , XMLExcepts::URL_UnsupportedProto1
                    , srcPtr
                    , fMemoryManager
                );
            }

            // And move our source pointer up past what we've processed
            srcPtr = (ptr1 + 1);
        }
    }

    //
    //  Ok, next we need to see if we have any host part. If the next
    //  two characters are //, then we need to check, else move on.
    //
    if ((*srcPtr == chForwardSlash) && (*(srcPtr + 1) == chForwardSlash))
    {
        // Move up past the slashes
        srcPtr += 2;

        //
        //  If we aren't at the end of the string, then there has to be a
        //  host part at this point. we will just look for the next / char
        //  or end of string and make all of that the host for now.
        //
        if (*srcPtr)
        {
            // Search from here for a / character
            ptr1 = XMLString::findAny(srcPtr, gListFour);

            //
            //  If we found something, then the host is between where
            //  we are and what we found. Else the host is the rest of
            //  the content and we are done. If its empty, leave it null.
            //
            if (ptr1)
            {
                if (ptr1 != srcPtr)
                {
                    fMemoryManager->deallocate(fHost);//delete [] fHost;
                    fHost = (XMLCh*) fMemoryManager->allocate
                    (
                        ((ptr1 - srcPtr) + 1) * sizeof(XMLCh)
                    );//new XMLCh[(ptr1 - srcPtr) + 1];
                    ptr2 = fHost;
                    while (srcPtr < ptr1)
                        *ptr2++ = *srcPtr++;
                    *ptr2 = 0;
                }
            }
             else
            {
                fMemoryManager->deallocate(fHost);//delete [] fHost;
                fHost = XMLString::replicate(srcPtr, fMemoryManager);

                // Update source pointer to the end
                srcPtr += XMLString::stringLen(fHost);
            }
        }
    }
    else
    {
        //
        // http protocol requires two forward slashes
        // we didn't get them, so throw an exception
        //
        if (fProtocol == HTTP) {
            ThrowXMLwithMemMgr
                (
                    MalformedURLException
                    , XMLExcepts::URL_ExpectingTwoSlashes
                    , fMemoryManager
                );
        }
    }

    //
    //  If there was a host part, then we have to grovel through it for
    //  all the bits and pieces it can hold.
    //
    if (fHost)
    {
        //
        //  Look for a '@' character, which indicates a user name. If we
        //  find one, then everything between the start of the host data
        //  and the character is the user name.
        //
        ptr1 = XMLString::findAny(fHost, gListTwo);
        if (ptr1)
        {
            // Get this info out as the user name
            *ptr1 = 0;
            fMemoryManager->deallocate(fUser);//delete [] fUser;
            fUser = XMLString::replicate(fHost, fMemoryManager);
            ptr1++;

            // And now cut these chars from the host string
            XMLString::cut(fHost, ptr1 - fHost);

            // Is there a password inside the user string?
            ptr2 = XMLString::findAny(fUser, gListThree);
            if (ptr2)
            {
                // Remove it from the user name string
                *ptr2 = 0;

                // And copy out the remainder to the password field
                ptr2++;
                fMemoryManager->deallocate(fPassword);//delete [] fPassword;
                fPassword = XMLString::replicate(ptr2, fMemoryManager);
            }
        }

        //
        //  Ok, so now we are at the actual host name, if any. If we are
        //  not at the end of the host data, then lets see if we have a
        //  port trailing the
        //
        ptr1 = XMLString::findAny(fHost, gListThree);
        if (ptr1)
        {
            // Remove it from the host name
            *ptr1 = 0;

            // Try to convert it to a numeric port value and store it
            ptr1++;
            if (!XMLString::textToBin(ptr1, fPortNum, fMemoryManager))
                ThrowXMLwithMemMgr(MalformedURLException, XMLExcepts::URL_BadPortField, fMemoryManager);
        }

        // If the host ended up empty, then toss is
        if (!*fHost)
        {
            fMemoryManager->deallocate(fHost);//delete[] fHost;
            fHost = 0;
        }
    }

    // If we are at the end, then we are done now
    if (!*srcPtr) {
        if(fHost) {
            static const XMLCh slash[] = { chForwardSlash, chNull };
            fPath = XMLString::replicate(slash, fMemoryManager);
        }
        return;
    }

    //
    //  Next is the path part. It can be absolute, i.e. starting with a
    //  forward slash character, or relative. Its basically everything up
    //  to the end of the string or to any trailing query or fragment.
    //
    ptr1 = XMLString::findAny(srcPtr, gListFive);
    if (!ptr1)
    {
        fMemoryManager->deallocate(fPath);//delete [] fPath;
        fPath = XMLString::replicate(srcPtr, fMemoryManager);
        return;
    }

    // Everything from where we are to what we found is the path
    if (ptr1 > srcPtr)
    {
        fMemoryManager->deallocate(fPath);//delete [] fPath;
        fPath = (XMLCh*) fMemoryManager->allocate
        (
            ((ptr1 - srcPtr) + 1) * sizeof(XMLCh)
        );//new XMLCh[(ptr1 - srcPtr) + 1];
        ptr2 = fPath;
        while (srcPtr < ptr1)
            *ptr2++ = *srcPtr++;
        *ptr2 = 0;
    }

    //
    //  If we found a fragment, then it is the rest of the string and we
    //  are done.
    //
    if (*srcPtr == chPound)
    {
        srcPtr++;
        fMemoryManager->deallocate(fFragment);//delete [] fFragment;
        fFragment = XMLString::replicate(srcPtr, fMemoryManager);
        return;
    }

    //
    //  The query is either the rest of the string, or up to the fragment
    //  separator.
    //
    srcPtr++;
    ptr1 = XMLString::findAny(srcPtr, gListSix);
    fMemoryManager->deallocate(fQuery);//delete [] fQuery;
    if (!ptr1)
    {
        fQuery = XMLString::replicate(srcPtr, fMemoryManager);
        return;
    }
     else
    {
        fQuery = (XMLCh*) fMemoryManager->allocate
        (
            ((ptr1 - srcPtr) + 1) * sizeof(XMLCh)
        );//new XMLCh[(ptr1 - srcPtr) + 1];
        ptr2 = fQuery;
        while (srcPtr < ptr1)
            *ptr2++ = *srcPtr++;
        *ptr2 = 0;
    }

    // If we are not at the end now, then everything else is the fragment
    if (*srcPtr == chPound)
    {
        srcPtr++;
        fMemoryManager->deallocate(fFragment);//delete [] fFragment;
        fFragment = XMLString::replicate(srcPtr, fMemoryManager);
    }
}